

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QMakeLocalFileName>::emplace<QMakeLocalFileName>
          (QGenericArrayOps<QMakeLocalFileName> *this,qsizetype i,QMakeLocalFileName *args)

{
  QMakeLocalFileName **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_a8;
  QMakeLocalFileName local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QMakeLocalFileName>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QMakeLocalFileName>).size == i) {
      qVar4 = QArrayDataPointer<QMakeLocalFileName>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QMakeLocalFileName>);
      if (qVar4 == 0) goto LAB_0015f581;
      QMakeLocalFileName::QMakeLocalFileName
                ((this->super_QArrayDataPointer<QMakeLocalFileName>).ptr +
                 (this->super_QArrayDataPointer<QMakeLocalFileName>).size,args);
LAB_0015f692:
      pqVar2 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0015f64b;
    }
LAB_0015f581:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QMakeLocalFileName>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QMakeLocalFileName>);
      if (qVar4 != 0) {
        QMakeLocalFileName::QMakeLocalFileName
                  ((this->super_QArrayDataPointer<QMakeLocalFileName>).ptr + -1,args);
        ppQVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0015f692;
      }
    }
  }
  local_58.local_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_58.local_name.d.size = -0x5555555555555556;
  local_58.real_name.d.size = -0x5555555555555556;
  local_58.local_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.real_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.real_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QMakeLocalFileName::QMakeLocalFileName(&local_58,args);
  bVar5 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size != 0;
  QArrayDataPointer<QMakeLocalFileName>::detachAndGrow
            (&this->super_QArrayDataPointer<QMakeLocalFileName>,(uint)(i == 0 && bVar5),1,
             (QMakeLocalFileName **)0x0,(QArrayDataPointer<QMakeLocalFileName> *)0x0);
  if (i == 0 && bVar5) {
    QMakeLocalFileName::QMakeLocalFileName
              ((this->super_QArrayDataPointer<QMakeLocalFileName>).ptr + -1,&local_58);
    ppQVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (QMakeLocalFileName *)0x0;
    local_a8.last = (QMakeLocalFileName *)0x0;
    local_a8.where = (QMakeLocalFileName *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    local_a8.data = &this->super_QArrayDataPointer<QMakeLocalFileName>;
    Inserter::insertOne(&local_a8,i,&local_58);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QMakeLocalFileName::~QMakeLocalFileName(&local_58);
LAB_0015f64b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }